

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Double.h
# Opt level: O0

void __thiscall
Double<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Double
          (Double<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *data_,UI c,UI r_max_,UI s_,size_t bound_coeff)

{
  size_type sVar1;
  size_t bound_coeff_local;
  UI s__local;
  UI r_max__local;
  UI c_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *data__local;
  Double<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->data);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->table_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->collision_indexes);
  std::
  vector<Quadratic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Quadratic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->quad);
  HashFunction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  HashFunction(&this->hash_fun);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->quad_indexes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->data,data_);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->data);
  this->n = sVar1;
  this->m = (ulong)c * this->n;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::resize(&this->table_,this->m);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->quad_indexes,this->m);
  this->r_max = r_max_;
  this->s = s_;
  this->bound = this->n * bound_coeff;
  return;
}

Assistant:

explicit Double(vector<T> & data_, UI c = 1, UI r_max_ = 1000, UI s_ = 4, size_t bound_coeff = 4) {
        data = data_;
        n = data.size();
        m = c * n;
        table_.resize(m);
        quad_indexes.resize(m);
        r_max = r_max_;
        s = s_;
        bound = n * bound_coeff;
    }